

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O0

PCSTR TagToString(int tag)

{
  uint uVar1;
  char *pcStack_10;
  int tag_local;
  
  uVar1 = tag & 0xff;
  if (uVar1 == 0) {
    pcStack_10 = "none(0)";
  }
  else if (uVar1 == 1) {
    pcStack_10 = "bool(1)";
  }
  else if (uVar1 == 2) {
    pcStack_10 = "any(2)";
  }
  else if (uVar1 == 0x40) {
    pcStack_10 = "empty(40)";
  }
  else if (uVar1 == 0x7c) {
    pcStack_10 = "f64(7C)";
  }
  else if (uVar1 == 0x7d) {
    pcStack_10 = "f32(7D)";
  }
  else if (uVar1 == 0x7e) {
    pcStack_10 = "i64(7E)";
  }
  else if (uVar1 == 0x7f) {
    pcStack_10 = "i32(7F)";
  }
  else if (uVar1 == 0x80) {
    pcStack_10 = "Value(1)";
  }
  else if (uVar1 == 0x81) {
    pcStack_10 = "Label(2)";
  }
  else if (uVar1 == 0x82) {
    pcStack_10 = "w3Frame(3)";
  }
  else {
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

PCSTR TagToString (int tag)
{
    switch ((w3Tag)tag)
    {
    default:break;
    case Tag_none:     return "none(0)";
    case Tag_bool:     return "bool(1)";
    case Tag_any:      return "any(2)";
    case Tag_i32:      return "i32(7F)";
    case Tag_i64:      return "i64(7E)";
    case Tag_f32:      return "f32(7D)";
    case Tag_f64:      return "f64(7C)";
    case Tag_empty:    return "empty(40)";

    case Tag_Value:    return "Value(1)";
    case Tag_Label:    return "Label(2)";
    case Tag_Frame:    return "w3Frame(3)";
    }
    return "unknown";
}